

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outdata_reply.c
# Opt level: O0

int mpt_outdata_reply(mpt_outdata *out,size_t len,void *hdr,mpt_message *src)

{
  mpt_buffer *pmVar1;
  long lVar2;
  ssize_t sVar3;
  size_t left;
  mpt_message msg;
  uint16_t max;
  uint8_t slen;
  uint8_t ilen;
  int ret;
  uint8_t *ptr;
  uint8_t tmp [256];
  mpt_message *src_local;
  void *hdr_local;
  size_t len_local;
  mpt_outdata *out_local;
  
  _max = &ptr;
  if ((out->sock)._id < 0) {
    out_local._4_4_ = -1;
  }
  else {
    msg.clen._3_1_ = out->_idlen;
    msg.clen._2_1_ = out->_smax;
    msg.clen._0_2_ = (ushort)msg.clen._3_1_ + (ushort)msg.clen._2_1_;
    if (((ushort)msg.clen < len) || (len < msg.clen._3_1_)) {
      out_local._4_4_ = -2;
    }
    else {
      src_local = (mpt_message *)hdr;
      if (msg.clen._3_1_ != 0) {
        memcpy(&ptr,hdr,(ulong)msg.clen._3_1_);
        src_local = (mpt_message *)((long)hdr + (long)(int)(uint)msg.clen._3_1_);
      }
      if ((msg.clen._2_1_ == 0) ||
         (msg.clen._2_1_ = (char)len - msg.clen._3_1_, msg.clen._2_1_ == 0)) {
        src_local = (mpt_message *)0x0;
      }
      hdr_local = (void *)0x0;
      if (src != (mpt_message *)0x0) {
        left = src->used;
        msg.used = (size_t)src->base;
        msg.base = src->cont;
        msg.cont = (iovec *)src->clen;
        hdr_local = (void *)mpt_message_read(&left,0x100 - (ulong)msg.clen._3_1_,
                                             tmp + (long)(int)(uint)msg.clen._3_1_ + -8);
        lVar2 = mpt_message_length(&left);
        if (lVar2 != 0) {
          lVar2 = (ulong)msg.clen._3_1_ + lVar2 + (long)hdr_local;
          _max = (uint8_t **)mpt_array_append(out,lVar2,0);
          if (_max == (uint8_t **)0x0) {
            return -0x11;
          }
          pmVar1 = (out->buf)._buf;
          pmVar1->_used = pmVar1->_used - lVar2;
          if (msg.clen._3_1_ != 0) {
            memcpy(_max,src_local,(ulong)msg.clen._3_1_);
          }
          hdr_local = (void *)mpt_message_read(&left,lVar2 - (ulong)msg.clen._3_1_,
                                               (long)_max + (long)(int)(uint)msg.clen._3_1_);
        }
      }
      sVar3 = sendto((out->sock)._id,_max,(ulong)msg.clen._3_1_ + (long)hdr_local,0,
                     (sockaddr *)src_local,(uint)msg.clen._2_1_);
      out_local._4_4_ = (int)sVar3;
      if (out_local._4_4_ < 0) {
        out_local._4_4_ = -4;
      }
    }
  }
  return out_local._4_4_;
}

Assistant:

extern int mpt_outdata_reply(MPT_STRUCT(outdata) *out, size_t len, const void *hdr, const MPT_STRUCT(message) *src)
{
	uint8_t tmp[0x100]; /* 256b reply limit */
	uint8_t *ptr = tmp;
	int ret;
	uint8_t ilen, slen;
	uint16_t max;
	
	/* already answered */
	if (!MPT_socket_active(&out->sock)) {
		return MPT_ERROR(BadArgument);
	}
	ilen = out->_idlen;
	slen = out->_smax;
	max = ilen + slen;
	
	if (len > max || len < ilen) {
		return MPT_ERROR(BadValue);
	}
	if (ilen) {
		memcpy(tmp, hdr, ilen);
		hdr = ((uint8_t *) hdr) + ilen;
	}
	if (!slen || !(slen = len - ilen)) {
		hdr = 0;
	}
	len = 0;
	if (src) {
		MPT_STRUCT(message) msg = *src;
		size_t left;
		len = mpt_message_read(&msg, sizeof(tmp) - ilen, tmp + ilen);
		/* temporary reply limit exceeded */
		if ((left = mpt_message_length(&msg))) {
			len += ilen + left;
			/* use temporary data in unused buffer segment */
			if (!(ptr = mpt_array_append(&out->buf, len, 0))) {
				return MPT_ERROR(MissingBuffer);
			}
			out->buf._buf->_used -= len;
			if (ilen) {
				memcpy(ptr, hdr, ilen);
			}
			len = mpt_message_read(&msg, len - ilen, ptr + ilen);
		}
	}
	ret = sendto(out->sock._id, ptr, ilen + len, 0, hdr, slen);
	
	if (ret < 0) {
		return MPT_ERROR(BadOperation);
	}
	return ret;
}